

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x855ba8;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x855c20;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x88 = 0x855bd0;
  (this->super_IfcControl).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x855bf8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcControl).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x855cc0;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x855ce8;
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}